

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O0

int nn_sock_recv(nn_sock *self,nn_msg *msg,int flags)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint64_t uVar4;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int timeout;
  uint64_t now;
  uint64_t deadline;
  int rc;
  long in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  FILE *__stream;
  undefined4 uVar5;
  ulong local_28;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((*(uint *)(*(long *)(in_RDI + 0x68) + 8) & 1) == 0) {
    nn_ctx_enter((nn_ctx *)0x1d1454);
    if (*(int *)(in_RDI + 0x150) < 0) {
      local_28 = 0xffffffffffffffff;
      uVar5 = 0xffffffff;
    }
    else {
      uVar4 = nn_clock_ms();
      local_28 = uVar4 + (long)*(int *)(in_RDI + 0x150);
      uVar5 = *(undefined4 *)(in_RDI + 0x150);
    }
    while ((iVar2 = *(int *)(in_RDI + 0x58), iVar2 - 1U < 2 || (2 < iVar2 - 3U))) {
      iVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x40))
                        (*(undefined8 *)(in_RDI + 0x60),in_RSI);
      if (iVar1 == 0) {
        nn_ctx_leave((nn_ctx *)((ulong)in_EDX << 0x20));
        return 0;
      }
      if (-1 < iVar1) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x2c1);
        fflush(_stderr);
        nn_err_abort();
      }
      if (iVar1 != -0xb) {
        nn_ctx_leave((nn_ctx *)CONCAT44(in_EDX,iVar1));
        return iVar1;
      }
      if ((in_EDX & 1) != 0) {
        nn_ctx_leave((nn_ctx *)CONCAT44(in_EDX,0xfffffff5));
        return -0xb;
      }
      nn_ctx_leave((nn_ctx *)CONCAT44(in_EDX,0xfffffff5));
      in_stack_ffffffffffffffe0 =
           nn_efd_wait((nn_efd *)CONCAT44(uVar5,iVar2),
                       (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      iVar1 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      if (in_stack_ffffffffffffffe0 == 0xffffff92) {
        return -0x6e;
      }
      if (in_stack_ffffffffffffffe0 == 0xfffffffc) {
        return -4;
      }
      if (in_stack_ffffffffffffffe0 == 0xfffffff7) {
        return -9;
      }
      if (in_stack_ffffffffffffffe0 != 0) {
        nn_backtrace_print();
        __stream = _stderr;
        pcVar3 = nn_err_strerror(iVar1);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)in_stack_ffffffffffffffe0,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/sock.c"
                ,0x2da);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_ctx_enter((nn_ctx *)0x1d16fb);
      iVar2 = nn_efd_wait((nn_efd *)CONCAT44(uVar5,iVar2),
                          (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      if (iVar2 == 0) {
        *(uint *)(in_RDI + 0x70) = *(uint *)(in_RDI + 0x70) | 1;
      }
      if (-1 < *(int *)(in_RDI + 0x150)) {
        uVar4 = nn_clock_ms();
        if (local_28 < uVar4) {
          in_stack_ffffffffffffffb8 = 0;
        }
        else {
          in_stack_ffffffffffffffb8 = local_28 - uVar4;
        }
        uVar5 = (undefined4)in_stack_ffffffffffffffb8;
      }
    }
    nn_ctx_leave((nn_ctx *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    local_4 = -9;
  }
  else {
    local_4 = -0x5f;
  }
  return local_4;
}

Assistant:

int nn_sock_recv (struct nn_sock *self, struct nn_msg *msg, int flags)
{
    int rc;
    uint64_t deadline;
    uint64_t now;
    int timeout;

    /*  Some sockets types cannot be used for receiving messages. */
    if (nn_slow (self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV))
        return -ENOTSUP;

    nn_ctx_enter (&self->ctx);

    /*  Compute the deadline for RCVTIMEO timer. */
    if (self->rcvtimeo < 0) {
        deadline = -1;
        timeout = -1;
    }
    else {
        deadline = nn_clock_ms() + self->rcvtimeo;
        timeout = self->rcvtimeo;
    }

    while (1) {

        switch (self->state) {
        case NN_SOCK_STATE_ACTIVE:
        case NN_SOCK_STATE_INIT:
             break;

        case NN_SOCK_STATE_STOPPING_EPS:
        case NN_SOCK_STATE_STOPPING:
        case NN_SOCK_STATE_FINI:
            /*  Socket closed or closing.  Should we return something
                else here; recvmsg(2) for example returns no data in
                this case, like read(2).  The use of indexed file
                descriptors is further problematic, as an FD can be reused
                leading to situations where technically the outstanding
                operation should refer to some other socket entirely.  */
            nn_ctx_leave (&self->ctx);
            return -EBADF;
        }

        /*  Try to receive the message in a non-blocking way. */
        rc = self->sockbase->vfptr->recv (self->sockbase, msg);
        if (nn_fast (rc == 0)) {
            nn_ctx_leave (&self->ctx);
            return 0;
        }
        nn_assert (rc < 0);

        /*  Any unexpected error is forwarded to the caller. */
        if (nn_slow (rc != -EAGAIN)) {
            nn_ctx_leave (&self->ctx);
            return rc;
        }

        /*  If the message cannot be received at the moment and the recv call
            is non-blocking, return immediately. */
        if (nn_fast (flags & NN_DONTWAIT)) {
            nn_ctx_leave (&self->ctx);
            return -EAGAIN;
        }

        /*  With blocking recv, wait while there are new pipes available
            for receiving. */
        nn_ctx_leave (&self->ctx);
        rc = nn_efd_wait (&self->rcvfd, timeout);
        if (nn_slow (rc == -ETIMEDOUT))
            return -ETIMEDOUT;
        if (nn_slow (rc == -EINTR))
            return -EINTR;
        if (nn_slow (rc == -EBADF))
            return -EBADF;
        errnum_assert (rc == 0, rc);
        nn_ctx_enter (&self->ctx);
        /*
         *  Double check if pipes are still available for receiving
         */
        if (!nn_efd_wait (&self->rcvfd, 0)) {
            self->flags |= NN_SOCK_FLAG_IN;
        }

        /*  If needed, re-compute the timeout to reflect the time that have
            already elapsed. */
        if (self->rcvtimeo >= 0) {
            now = nn_clock_ms();
            timeout = (int) (now > deadline ? 0 : deadline - now);
        }
    }
}